

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

int Sbl_ManCriticalFanin(Sbl_Man_t *p,int iLut,Vec_Int_t *vFanins)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Delay;
  int iFan;
  int k;
  Vec_Int_t *vFanins_local;
  int iLut_local;
  Sbl_Man_t *p_local;
  
  iVar1 = Vec_IntEntry(p->vArrs,iLut);
  Delay = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vFanins);
    if (iVar2 <= Delay) {
      return -1;
    }
    iVar2 = Vec_IntEntry(vFanins,Delay);
    iVar3 = Vec_IntEntry(p->vArrs,iVar2);
    if (iVar3 + 1 == iVar1) break;
    Delay = Delay + 1;
  }
  return iVar2;
}

Assistant:

int Sbl_ManCriticalFanin( Sbl_Man_t * p, int iLut, Vec_Int_t * vFanins )
{
    int k, iFan, Delay = Vec_IntEntry(p->vArrs, iLut);
    Vec_IntForEachEntry( vFanins, iFan, k )
        if ( Vec_IntEntry(p->vArrs, iFan) + 1 == Delay )
            return iFan;
    return -1;
}